

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringtriebuilder.cpp
# Opt level: O1

int32_t __thiscall
icu_63::StringTrieBuilder::writeBranchSubNode
          (StringTrieBuilder *this,int32_t start,int32_t limit,int32_t unitIndex,int32_t length)

{
  char cVar1;
  ulong uVar2;
  int iVar3;
  uint uVar4;
  int32_t iVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  bool bVar13;
  UBool isFinal [4];
  int32_t starts [5];
  int32_t jumpTargets [4];
  UChar middleUnits [14];
  int32_t lessThan [14];
  undefined4 local_d8;
  char local_d4 [4];
  ulong local_d0;
  int32_t local_c4;
  ulong local_c0;
  uint local_b8 [6];
  ulong local_a0;
  int32_t aiStack_98 [3];
  ushort auStack_8c [14];
  uint auStack_70 [16];
  
  uVar8 = (ulong)(uint)length;
  uVar11 = (ulong)(uint)unitIndex;
  local_c4 = limit;
  iVar3 = (*(this->super_UObject)._vptr_UObject[0xb])();
  local_d0 = uVar11;
  if (iVar3 < length) {
    uVar12 = 0;
    do {
      uVar6 = (int)(uVar8 >> 0x1f) + (int)uVar8 >> 1;
      local_d8 = start;
      start = (*(this->super_UObject)._vptr_UObject[8])(this,(ulong)(uint)start,uVar11,(ulong)uVar6)
      ;
      iVar3 = (*(this->super_UObject)._vptr_UObject[4])(this,(ulong)(uint)start,uVar11);
      auStack_8c[uVar12 + 2] = (ushort)iVar3;
      uVar4 = writeBranchSubNode(this,local_d8,start,unitIndex,uVar6);
      auStack_70[uVar12 + 2] = uVar4;
      uVar12 = uVar12 + 1;
      uVar6 = (int)uVar8 - uVar6;
      uVar8 = (ulong)uVar6;
      iVar3 = (*(this->super_UObject)._vptr_UObject[0xb])(this);
    } while (iVar3 < (int)uVar6);
    unitIndex = (int32_t)local_d0;
    local_c0 = uVar12;
  }
  else {
    local_c0 = 0;
  }
  uVar11 = local_d0;
  local_d8 = unitIndex + 1;
  uVar4 = (int)uVar8 - 1;
  uVar12 = 1;
  if (1 < (int)uVar4) {
    uVar12 = (ulong)uVar4;
  }
  uVar7 = 1;
  local_a0 = uVar8;
  do {
    uVar8 = uVar7;
    local_b8[uVar8 - 1] = start;
    uVar4 = (*(this->super_UObject)._vptr_UObject[4])(this,(ulong)(uint)start,uVar11 & 0xffffffff);
    uVar4 = (*(this->super_UObject)._vptr_UObject[9])
                      (this,(ulong)(start + 1),uVar11 & 0xffffffff,(ulong)(uVar4 & 0xffff));
    if (start == uVar4 - 1) {
      iVar3 = (*(this->super_UObject)._vptr_UObject[3])(this,(ulong)(uint)start);
      bVar13 = local_d8 == iVar3;
    }
    else {
      bVar13 = false;
    }
    local_d4[uVar8 - 1] = bVar13;
    uVar2 = local_d0;
    uVar7 = uVar8 + 1;
    start = uVar4;
  } while (uVar8 != uVar12);
  local_b8[uVar8] = uVar4;
  uVar8 = local_a0;
  do {
    if (local_d4[uVar7 - 2] == '\0') {
      iVar5 = writeNode(this,local_b8[uVar7 - 2],local_b8[uVar7 - 1],local_d8);
      aiStack_98[uVar7 - 2] = iVar5;
    }
    uVar7 = uVar7 - 1;
  } while (1 < (long)uVar7);
  writeNode(this,uVar4,local_c4,local_d8);
  uVar4 = (*(this->super_UObject)._vptr_UObject[4])(this,(ulong)uVar4,uVar2 & 0xffffffff);
  iVar3 = (*(this->super_UObject)._vptr_UObject[0xf])(this,(ulong)(uVar4 & 0xffff));
  if (1 < (int)uVar8) {
    lVar10 = (ulong)((int)uVar8 - 2) + 1;
    do {
      uVar4 = local_b8[lVar10 + -1];
      cVar1 = local_d4[lVar10 + -1];
      if (cVar1 == '\0') {
        uVar6 = iVar3 - aiStack_98[lVar10 + -1];
      }
      else {
        uVar6 = (*(this->super_UObject)._vptr_UObject[5])(this,(ulong)uVar4);
      }
      (*(this->super_UObject)._vptr_UObject[0x11])(this,(ulong)uVar6,(ulong)(uint)(int)cVar1);
      uVar4 = (*(this->super_UObject)._vptr_UObject[4])(this,(ulong)uVar4,uVar2 & 0xffffffff);
      iVar3 = (*(this->super_UObject)._vptr_UObject[0xf])(this,(ulong)(uVar4 & 0xffff));
      lVar9 = lVar10 + -1;
      bVar13 = 0 < lVar10;
      lVar10 = lVar9;
    } while (lVar9 != 0 && bVar13);
  }
  if (0 < (int)local_c0) {
    lVar10 = (local_c0 & 0xffffffff) + 1;
    do {
      (*(this->super_UObject)._vptr_UObject[0x13])(this,(ulong)auStack_70[lVar10]);
      iVar3 = (*(this->super_UObject)._vptr_UObject[0xf])(this,(ulong)auStack_8c[lVar10]);
      lVar10 = lVar10 + -1;
    } while (1 < lVar10);
  }
  return iVar3;
}

Assistant:

int32_t
StringTrieBuilder::writeBranchSubNode(int32_t start, int32_t limit, int32_t unitIndex, int32_t length) {
    UChar middleUnits[kMaxSplitBranchLevels];
    int32_t lessThan[kMaxSplitBranchLevels];
    int32_t ltLength=0;
    while(length>getMaxBranchLinearSubNodeLength()) {
        // Branch on the middle unit.
        // First, find the middle unit.
        int32_t i=skipElementsBySomeUnits(start, unitIndex, length/2);
        // Encode the less-than branch first.
        middleUnits[ltLength]=getElementUnit(i, unitIndex);  // middle unit
        lessThan[ltLength]=writeBranchSubNode(start, i, unitIndex, length/2);
        ++ltLength;
        // Continue for the greater-or-equal branch.
        start=i;
        length=length-length/2;
    }
    // For each unit, find its elements array start and whether it has a final value.
    int32_t starts[kMaxBranchLinearSubNodeLength];
    UBool isFinal[kMaxBranchLinearSubNodeLength-1];
    int32_t unitNumber=0;
    do {
        int32_t i=starts[unitNumber]=start;
        UChar unit=getElementUnit(i++, unitIndex);
        i=indexOfElementWithNextUnit(i, unitIndex, unit);
        isFinal[unitNumber]= start==i-1 && unitIndex+1==getElementStringLength(start);
        start=i;
    } while(++unitNumber<length-1);
    // unitNumber==length-1, and the maxUnit elements range is [start..limit[
    starts[unitNumber]=start;

    // Write the sub-nodes in reverse order: The jump lengths are deltas from
    // after their own positions, so if we wrote the minUnit sub-node first,
    // then its jump delta would be larger.
    // Instead we write the minUnit sub-node last, for a shorter delta.
    int32_t jumpTargets[kMaxBranchLinearSubNodeLength-1];
    do {
        --unitNumber;
        if(!isFinal[unitNumber]) {
            jumpTargets[unitNumber]=writeNode(starts[unitNumber], starts[unitNumber+1], unitIndex+1);
        }
    } while(unitNumber>0);
    // The maxUnit sub-node is written as the very last one because we do
    // not jump for it at all.
    unitNumber=length-1;
    writeNode(start, limit, unitIndex+1);
    int32_t offset=write(getElementUnit(start, unitIndex));
    // Write the rest of this node's unit-value pairs.
    while(--unitNumber>=0) {
        start=starts[unitNumber];
        int32_t value;
        if(isFinal[unitNumber]) {
            // Write the final value for the one string ending with this unit.
            value=getElementValue(start);
        } else {
            // Write the delta to the start position of the sub-node.
            value=offset-jumpTargets[unitNumber];
        }
        writeValueAndFinal(value, isFinal[unitNumber]);
        offset=write(getElementUnit(start, unitIndex));
    }
    // Write the split-branch nodes.
    while(ltLength>0) {
        --ltLength;
        writeDeltaTo(lessThan[ltLength]);
        offset=write(middleUnits[ltLength]);
    }
    return offset;
}